

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

void __thiscall
amrex::FArrayBox::FArrayBox(FArrayBox *this,Box *b,int n,bool alloc,bool shared,Arena *ar)

{
  undefined3 in_register_00000009;
  
  BaseFab<double>::BaseFab(&this->super_BaseFab<double>,b,n,alloc,shared,ar);
  (this->super_BaseFab<double>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_006d8d38;
  *(undefined4 *)&(this->super_BaseFab<double>).field_0x44 = 0;
  if (CONCAT31(in_register_00000009,alloc) != 0) {
    initVal(this);
    return;
  }
  return;
}

Assistant:

FArrayBox::FArrayBox (const Box& b, int n, bool alloc, bool shared, Arena* ar)
    : BaseFab<Real>(b,n,alloc,shared,ar)
{
    if (alloc) initVal();
}